

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *this_00;
  char *pcVar1;
  _Base_ptr p_Var2;
  _Alloc_hider _Var3;
  string libext;
  string reg;
  string reg_static;
  string reg_any;
  string local_50;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&libext,"CMAKE_STATIC_LIBRARY_PREFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkPrefix(this,pcVar1);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_SHARED_LIBRARY_PREFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkPrefix(this,pcVar1);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkExtension(this,pcVar1,LinkShared);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_STATIC_LIBRARY_SUFFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkExtension(this,pcVar1,LinkStatic);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_SHARED_LIBRARY_SUFFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkExtension(this,pcVar1,LinkShared);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  AddLinkExtension(this,pcVar1,LinkUnknown);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string((string *)&libext,"CMAKE_EXTRA_LINK_EXTENSIONS",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  std::__cxx11::string::~string((string *)&libext);
  if (pcVar1 != (char *)0x0) {
    reg._M_dataplus._M_p = (pointer)0x0;
    reg._M_string_length = 0;
    reg.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&libext,pcVar1,(allocator *)&reg_any);
    cmSystemTools::ExpandListArgument
              (&libext,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&reg,false);
    std::__cxx11::string::~string((string *)&libext);
    for (_Var3 = reg._M_dataplus; _Var3._M_p != (pointer)reg._M_string_length;
        _Var3._M_p = _Var3._M_p + 0x20) {
      AddLinkExtension(this,*(char **)_Var3._M_p,LinkUnknown);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reg);
  }
  std::__cxx11::string::string
            ((string *)&libext,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",(allocator *)&reg);
  pcVar1 = cmMakefile::GetDefinition(this_00,&libext);
  std::__cxx11::string::~string((string *)&libext);
  if (pcVar1 != (char *)0x0) {
    reg._M_dataplus._M_p = (pointer)0x0;
    reg._M_string_length = 0;
    reg.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&libext,pcVar1,(allocator *)&reg_any);
    cmSystemTools::ExpandListArgument
              (&libext,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&reg,false);
    std::__cxx11::string::~string((string *)&libext);
    for (_Var3 = reg._M_dataplus; _Var3._M_p != (pointer)reg._M_string_length;
        _Var3._M_p = _Var3._M_p + 0x20) {
      AddLinkExtension(this,*(char **)_Var3._M_p,LinkShared);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reg);
  }
  CreateExtensionRegex(&libext,this,&this->LinkExtensions,LinkUnknown);
  std::__cxx11::string::string((string *)&reg,"(.*)",(allocator *)&reg_any);
  std::__cxx11::string::append((string *)&reg);
  cmOrderDirectories::SetLinkExtensionInfo(this->OrderLinkerSearchPath,&this->LinkExtensions,&reg);
  std::__cxx11::string::assign((char *)&reg);
  for (p_Var2 = (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::append((string *)&reg);
    std::__cxx11::string::append((char *)&reg);
  }
  std::__cxx11::string::append((char *)&reg);
  std::__cxx11::string::append((char *)&reg);
  std::__cxx11::string::string((string *)&reg_any,(string *)&reg);
  std::__cxx11::string::append((string *)&reg_any);
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,reg_any._M_dataplus._M_p);
  if ((this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&reg_static,(string *)&reg);
    CreateExtensionRegex(&local_50,this,&this->StaticLinkExtensions,LinkStatic);
    std::__cxx11::string::append((string *)&reg_static);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,reg_static._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&reg_static);
  }
  if ((this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&reg_static,(string *)&reg);
    CreateExtensionRegex(&local_50,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((string *)&reg_static);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,reg_static._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&reg_static);
  }
  std::__cxx11::string::~string((string *)&reg_any);
  std::__cxx11::string::~string((string *)&reg);
  std::__cxx11::string::~string((string *)&libext);
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if(const char* linkSuffixes =
     mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS"))
    {
    std::vector<std::string> linkSuffixVec;
    cmSystemTools::ExpandListArgument(linkSuffixes, linkSuffixVec);
    for(std::vector<std::string>::iterator i = linkSuffixVec.begin();
        i != linkSuffixVec.end(); ++i)
      {
      this->AddLinkExtension(i->c_str(), LinkUnknown);
      }
    }
  if(const char* sharedSuffixes =
     mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES"))
    {
    std::vector<std::string> sharedSuffixVec;
    cmSystemTools::ExpandListArgument(sharedSuffixes, sharedSuffixVec);
    for(std::vector<std::string>::iterator i = sharedSuffixVec.begin();
        i != sharedSuffixVec.end(); ++i)
      {
      this->AddLinkExtension(i->c_str(), LinkShared);
      }
    }

  // Compute a regex to match link extensions.
  std::string libext = this->CreateExtensionRegex(this->LinkExtensions,
                                                  LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions,
                                                    reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for(std::set<std::string>::iterator p = this->LinkPrefixes.begin();
      p != this->LinkPrefixes.end(); ++p)
    {
    reg += *p;
    reg += "|";
    }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = reg;
  reg_any += libext;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any.c_str());

  // Create a regex to match static library names.
  if(!this->StaticLinkExtensions.empty())
    {
    std::string reg_static = reg;
    reg_static += this->CreateExtensionRegex(this->StaticLinkExtensions,
                                             LinkStatic);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static.c_str());
    }

  // Create a regex to match shared library names.
  if(!this->SharedLinkExtensions.empty())
    {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared.c_str());
    }
}